

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_vfprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  char *local_98;
  int local_80;
  int local_7c;
  int nLen;
  int n;
  SySet sArg;
  io_private *pDev;
  jx9_hashmap *pMap;
  char *zFormat;
  fprintf_data sFdata;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sFdata.nCount = (jx9_int64)apArg;
  if ((((nArg < 3) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) ||
      (iVar1 = jx9_value_is_string(*(jx9_value **)(sFdata.nCount + 8)), iVar1 == 0)) ||
     (iVar1 = jx9_value_is_json_array(*(jx9_value **)(sFdata.nCount + 0x10)), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Invalid arguments");
    jx9_result_int(pCtx,0);
    return 0;
  }
  sArg.pUserData = jx9_value_to_resource(*(jx9_value **)sFdata.nCount);
  if (((long *)sArg.pUserData == (long *)0x0) || (*(int *)((long)sArg.pUserData + 0x34) != 0xfeac14)
     ) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_int(pCtx,0);
    return 0;
  }
  if ((*sArg.pUserData != 0) && (*(long *)(*sArg.pUserData + 0x40) != 0)) {
    pcVar2 = jx9_value_to_string(*(jx9_value **)(sFdata.nCount + 8),&local_80);
    if (local_80 < 1) {
      jx9_result_int(pCtx,0);
      return 0;
    }
    local_7c = jx9HashmapValuesToSet
                         ((jx9_hashmap *)**(undefined8 **)(sFdata.nCount + 0x10),(SySet *)&nLen);
    sFdata.pIO = (io_private *)0x0;
    zFormat = (char *)sArg.pUserData;
    jx9InputFormat(fprintfConsumer,pCtx,pcVar2,local_80,local_7c,(jx9_value **)sArg.pAllocator,
                   &zFormat,1);
    jx9_result_int64(pCtx,(jx9_int64)sFdata.pIO);
    SySetRelease((SySet *)&nLen);
    return 0;
  }
  pcVar2 = jx9_function_name(pCtx);
  if (*sArg.pUserData == 0) {
    local_98 = "null_stream";
  }
  else {
    local_98 = (char *)**sArg.pUserData;
  }
  jx9_context_throw_error_format
            (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",pcVar2,
             local_98);
  jx9_result_int(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_vfprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	jx9_hashmap *pMap;
	io_private *pDev;
	SySet sArg;
	int n, nLen;
	if( nArg < 3 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1])  || !jx9_value_is_json_array(apArg[2]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to hashmap */
	pMap = (jx9_hashmap *)apArg[2]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), (void *)&sFdata, TRUE);
	/* Return total number of bytes written*/
	jx9_result_int64(pCtx, sFdata.nCount);
	SySetRelease(&sArg);
	return JX9_OK;
}